

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict
sexp_make_lambda_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict name,
                   sexp_conflict params,sexp_conflict body,sexp_conflict locals)

{
  sexp_conflict psVar1;
  
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x60,0x1c);
  (psVar1->value).type.name = name;
  (psVar1->value).type.cpl = params;
  (psVar1->value).type.slots = body;
  (psVar1->value).type.setters = locals;
  (psVar1->value).port.offset = 0x23e;
  (psVar1->value).port.line = 0x23e;
  (psVar1->value).bytecode.length = 0x23e;
  (psVar1->value).port.flags = 0x3e;
  (psVar1->value).port.size = 0x23e;
  return psVar1;
}

Assistant:

sexp sexp_make_lambda_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp params, sexp body, sexp locals) {
  sexp res = sexp_alloc_type(ctx, lambda, SEXP_LAMBDA);
  sexp_lambda_name(res) = name;
  sexp_lambda_params(res) = params;
  sexp_lambda_body(res) = body;
  sexp_lambda_locals(res) = locals;
  sexp_lambda_fv(res) = SEXP_NULL;
  sexp_lambda_sv(res) = SEXP_NULL;
  sexp_lambda_defs(res) = SEXP_NULL;
  sexp_lambda_return_type(res) = SEXP_FALSE;
  sexp_lambda_param_types(res) = SEXP_NULL;
  return res;
}